

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

int iutest::detail::iuPairwiseGeneratorBase::GetParam<2,int>
              (vector<int,_std::allocator<int>_> *params,ParamIndexes<2> *indexes,int raw)

{
  result_type seed;
  int iVar1;
  Variable *pVVar2;
  iuTypedRandom<int> rnd;
  iuRandom local_30;
  
  pVVar2 = TestEnv::get_vars();
  seed = iuRandom::Engine::gen(&(pVVar2->m_genrand).m_engine);
  iuRandom::iuRandom(&local_30,seed);
  iVar1 = GetParamIndex<2,iutest::detail::iuTypedRandom<int>>
                    (indexes,raw,
                     (int)((ulong)((long)(params->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(params->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start) >> 2),
                     (iuTypedRandom<int> *)&local_30);
  return (params->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start[iVar1];
}

Assistant:

static T GetParam(const ::std::vector<T>& params, const ParamIndexes<N>& indexes, int raw)
    {
        iuTypedRandom<int> rnd(TestEnv::genrand()());
        const int index = GetParamIndex(indexes, raw, static_cast<int>(params.size()), rnd);
        return params[index];
    }